

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifySchema(Parse *pParse,int iDb)

{
  int iVar1;
  uint uVar2;
  Vdbe *p;
  Parse *local_40;
  yDbMask mask;
  sqlite3 *db;
  Vdbe *v;
  Parse *pToplevel;
  int iDb_local;
  Parse *pParse_local;
  
  local_40 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_40 = pParse->pToplevel;
  }
  if (local_40 != pParse) {
    pParse->cookieGoto = -1;
  }
  if (local_40->cookieGoto == 0) {
    p = sqlite3GetVdbe(local_40);
    if (p == (Vdbe *)0x0) {
      return;
    }
    iVar1 = sqlite3VdbeAddOp2(p,1,0,0);
    local_40->cookieGoto = iVar1 + 1;
  }
  if (-1 < iDb) {
    uVar2 = 1 << ((byte)iDb & 0x1f);
    if ((local_40->cookieMask & uVar2) == 0) {
      local_40->cookieMask = uVar2 | local_40->cookieMask;
      local_40->cookieValue[iDb] = (local_40->db->aDb[iDb].pSchema)->schema_cookie;
      if (iDb == 1) {
        sqlite3OpenTempDatabase(local_40);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifySchema(Parse *pParse, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);

#ifndef SQLITE_OMIT_TRIGGER
  if( pToplevel!=pParse ){
    /* This branch is taken if a trigger is currently being coded. In this
    ** case, set cookieGoto to a non-zero value to show that this function
    ** has been called. This is used by the sqlite3ExprCodeConstants()
    ** function. */
    pParse->cookieGoto = -1;
  }
#endif
  if( pToplevel->cookieGoto==0 ){
    Vdbe *v = sqlite3GetVdbe(pToplevel);
    if( v==0 ) return;  /* This only happens if there was a prior error */
    pToplevel->cookieGoto = sqlite3VdbeAddOp2(v, OP_Goto, 0, 0)+1;
  }
  if( iDb>=0 ){
    sqlite3 *db = pToplevel->db;
    yDbMask mask;

    assert( iDb<db->nDb );
    assert( db->aDb[iDb].pBt!=0 || iDb==1 );
    assert( iDb<SQLITE_MAX_ATTACHED+2 );
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    mask = ((yDbMask)1)<<iDb;
    if( (pToplevel->cookieMask & mask)==0 ){
      pToplevel->cookieMask |= mask;
      pToplevel->cookieValue[iDb] = db->aDb[iDb].pSchema->schema_cookie;
      if( !OMIT_TEMPDB && iDb==1 ){
        sqlite3OpenTempDatabase(pToplevel);
      }
    }
  }
}